

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camera.h
# Opt level: O2

void __thiscall gmath::Camera::~Camera(Camera *this)

{
  this->_vptr_Camera = (_func_int **)&PTR__Camera_00173850;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->match);
  std::__cxx11::string::~string((string *)&this->name);
  return;
}

Assistant:

virtual ~Camera() {}